

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O0

void basic_suite::fail_true_comma_true(void)

{
  error_code eVar1;
  undefined4 local_1cc;
  int local_1c8 [2];
  error_category *local_1c0;
  undefined1 local_1b3;
  undefined1 local_1b2 [2];
  view_type local_1b0;
  undefined1 local_19b;
  undefined1 local_19a [2];
  undefined4 local_198;
  value local_194 [6];
  undefined4 local_17c;
  value local_178 [2];
  basic_string_view<char,_std::char_traits<char>_> local_170;
  undefined1 local_160 [8];
  reader reader;
  char input [10];
  
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x7572742c65757274;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_170,
             (char *)&reader.stack.c.
                      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_160,&local_170);
  local_178[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_17c = 6;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::true_value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xed,"void basic_suite::fail_true_comma_true()",local_178,&local_17c);
  local_194[0] = trial::protocol::json::basic_reader<char>::symbol((basic_reader<char> *)local_160);
  local_198 = 3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::symbol::value,trial::protocol::json::token::symbol::value>
            ("reader.symbol()","token::symbol::boolean",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xee,"void basic_suite::fail_true_comma_true()",local_194,&local_198);
  local_19a[0] = trial::protocol::json::basic_reader<char>::value<bool>
                           ((basic_reader<char> *)local_160);
  local_19b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.value<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xef,"void basic_suite::fail_true_comma_true()",local_19a,&local_19b);
  local_1b0 = trial::protocol::json::basic_reader<char>::literal((basic_reader<char> *)local_160);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[5]>
            ("reader.literal()","\"true\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xf0,"void basic_suite::fail_true_comma_true()",&local_1b0,"true");
  local_1b2[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_160);
  local_1b3 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xf1,"void basic_suite::fail_true_comma_true()",local_1b2,&local_1b3);
  eVar1 = trial::protocol::json::basic_reader<char>::error((basic_reader<char> *)local_160);
  local_1c0 = eVar1._M_cat;
  local_1c8[0] = eVar1._M_value;
  local_1cc = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::error_code,trial::protocol::json::errc>
            ("reader.error()","json::unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xf2,"void basic_suite::fail_true_comma_true()",local_1c8,&local_1cc);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_160);
  return;
}

Assistant:

void fail_true_comma_true()
{
    const char input[] = "true,true";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::true_value);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::boolean);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<bool>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "true");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.error(), json::unexpected_token);
}